

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O2

DdNode * Cudd_CProjection(DdManager *dd,DdNode *R,DdNode *Y)

{
  int *piVar1;
  int iVar2;
  DdNode *Ysupp;
  DdNode *pDVar3;
  
  iVar2 = cuddCheckCube(dd,Y);
  if (iVar2 == 0) {
    fwrite("Error: The third argument of Cudd_CProjection should be a cube\n",0x3f,1,(FILE *)dd->err
          );
    dd->errorCode = CUDD_INVALID_ARG;
  }
  else {
    Ysupp = Cudd_Support(dd,Y);
    if (Ysupp != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)Ysupp & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      do {
        dd->reordered = 0;
        pDVar3 = cuddCProjectionRecur(dd,R,Y,Ysupp);
      } while (dd->reordered == 1);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,Ysupp);
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar3;
      }
      Cudd_RecursiveDeref(dd,Ysupp);
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_CProjection(
  DdManager * dd,
  DdNode * R,
  DdNode * Y)
{
    DdNode *res;
    DdNode *support;

    if (cuddCheckCube(dd,Y) == 0) {
        (void) fprintf(dd->err,
        "Error: The third argument of Cudd_CProjection should be a cube\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    /* Compute the support of Y, which is used by the abstraction step
    ** in cuddCProjectionRecur.
    */
    support = Cudd_Support(dd,Y);
    if (support == NULL) return(NULL);
    cuddRef(support);

    do {
        dd->reordered = 0;
        res = cuddCProjectionRecur(dd,R,Y,support);
    } while (dd->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(dd,support);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd,support);
    cuddDeref(res);

    return(res);

}